

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

ctmbstr textFromOneNode(TidyDocImpl *doc,Node *node)

{
  tmbchar *ptVar1;
  tmbstr txt;
  uint x;
  uint i;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  txt._0_4_ = 0;
  ptVar1 = (doc->access).text;
  if (node != (Node *)0x0) {
    txt._4_4_ = node->start;
    for (; (txt._4_4_ < node->end &&
           (ptVar1[(uint)txt] = doc->lexer->lexbuf[txt._4_4_], (uint)txt < 0x7f));
        txt._0_4_ = (uint)txt + 1) {
      txt._4_4_ = txt._4_4_ + 1;
    }
  }
  ptVar1[(uint)txt] = '\0';
  return ptVar1;
}

Assistant:

static ctmbstr textFromOneNode( TidyDocImpl* doc, Node* node )
{
    uint i;
    uint x = 0;
    tmbstr txt = doc->access.text;
    
    if ( node )
    {
        /* Copy contents of a text node */
        for (i = node->start; i < node->end; ++i, ++x )
        {
            txt[x] = doc->lexer->lexbuf[i];

            /* Check buffer overflow */
            if ( x >= sizeof(doc->access.text)-1 )
                break;
        }
    }

    txt[x] = '\0';
    return txt;
}